

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::bc1_get_block_colors4
               (uint32_t *block_r,uint32_t *block_g,uint32_t *block_b,uint32_t lr,uint32_t lg,
               uint32_t lb,uint32_t hr,uint32_t hg,uint32_t hb)

{
  uint uVar1;
  uint in_ECX;
  uint *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  uint in_R9D;
  
  *in_RDI = in_ECX << 3 | in_ECX >> 2;
  *in_RSI = in_R8D << 2 | in_R8D >> 4;
  *in_RDX = in_R9D << 3 | in_R9D >> 2;
  in_RDI[3] = lg << 3 | lg >> 2;
  in_RSI[3] = (uint)block_b << 2 | (uint)block_b >> 4;
  in_RDX[3] = (uint)block_g << 3 | (uint)block_g >> 2;
  if (g_bc1_approx_mode == 0) {
    in_RDI[1] = (*in_RDI * 2 + in_RDI[3]) / 3;
    in_RSI[1] = (*in_RSI * 2 + in_RSI[3]) / 3;
    in_RDX[1] = (*in_RDX * 2 + in_RDX[3]) / 3;
    in_RDI[2] = (in_RDI[3] * 2 + *in_RDI) / 3;
    in_RSI[2] = (in_RSI[3] * 2 + *in_RSI) / 3;
    in_RDX[2] = (in_RDX[3] * 2 + *in_RDX) / 3;
  }
  else if (g_bc1_approx_mode == 3) {
    in_RDI[1] = (*in_RDI * 2 + in_RDI[3] + 1) / 3;
    in_RSI[1] = (*in_RSI * 2 + in_RSI[3] + 1) / 3;
    in_RDX[1] = (*in_RDX * 2 + in_RDX[3] + 1) / 3;
    in_RDI[2] = (in_RDI[3] * 2 + *in_RDI + 1) / 3;
    in_RSI[2] = (in_RSI[3] * 2 + *in_RSI + 1) / 3;
    in_RDX[2] = (in_RDX[3] * 2 + *in_RDX + 1) / 3;
  }
  else if (g_bc1_approx_mode == 2) {
    uVar1 = interp_5_6_amd(*in_RDI,in_RDI[3]);
    in_RDI[1] = uVar1;
    uVar1 = interp_5_6_amd(*in_RSI,in_RSI[3]);
    in_RSI[1] = uVar1;
    uVar1 = interp_5_6_amd(*in_RDX,in_RDX[3]);
    in_RDX[1] = uVar1;
    uVar1 = interp_5_6_amd(in_RDI[3],*in_RDI);
    in_RDI[2] = uVar1;
    uVar1 = interp_5_6_amd(in_RSI[3],*in_RSI);
    in_RSI[2] = uVar1;
    uVar1 = interp_5_6_amd(in_RDX[3],*in_RDX);
    in_RDX[2] = uVar1;
  }
  else {
    uVar1 = interp_5_nv(in_ECX,lg);
    in_RDI[1] = uVar1;
    uVar1 = interp_6_nv(*in_RSI,in_RSI[3]);
    in_RSI[1] = uVar1;
    uVar1 = interp_5_nv(in_R9D,(uint)block_g);
    in_RDX[1] = uVar1;
    uVar1 = interp_5_nv(lg,in_ECX);
    in_RDI[2] = uVar1;
    uVar1 = interp_6_nv(in_RSI[3],*in_RSI);
    in_RSI[2] = uVar1;
    uVar1 = interp_5_nv((uint)block_g,in_R9D);
    in_RDX[2] = uVar1;
  }
  return;
}

Assistant:

static inline void bc1_get_block_colors4(uint32_t block_r[4], uint32_t block_g[4], uint32_t block_b[4], uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb)
	{
		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);

		if (g_bc1_approx_mode == bc1_approx_mode::cBC1Ideal)
		{
			block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
			block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;
		}
		else if (g_bc1_approx_mode == bc1_approx_mode::cBC1IdealRound4)
		{
			block_r[1] = (block_r[0] * 2 + block_r[3] + 1) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3] + 1) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3] + 1) / 3;
			block_r[2] = (block_r[3] * 2 + block_r[0] + 1) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0] + 1) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0] + 1) / 3;
		}
		else if (g_bc1_approx_mode == bc1_approx_mode::cBC1AMD)
		{
			block_r[1] = interp_5_6_amd(block_r[0], block_r[3]); block_g[1] = interp_5_6_amd(block_g[0], block_g[3]); block_b[1] = interp_5_6_amd(block_b[0], block_b[3]);
			block_r[2] = interp_5_6_amd(block_r[3], block_r[0]); block_g[2] = interp_5_6_amd(block_g[3], block_g[0]); block_b[2] = interp_5_6_amd(block_b[3], block_b[0]);
		}
		else
		{
			block_r[1] = interp_5_nv(lr, hr); block_g[1] = interp_6_nv(block_g[0], block_g[3]); block_b[1] = interp_5_nv(lb, hb);
			block_r[2] = interp_5_nv(hr, lr); block_g[2] = interp_6_nv(block_g[3], block_g[0]); block_b[2] = interp_5_nv(hb, lb);
		}
	}